

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::BNLL_x86_avx512::forward_inplace(BNLL_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float afVar48 [16];
  float afVar49 [16];
  int iVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  long lVar54;
  undefined1 (*pauVar55) [64];
  long lVar56;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  float fVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  float afVar108 [16];
  undefined1 auVar109 [32];
  float afVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  float afVar114 [16];
  float afVar115 [16];
  float afVar116 [16];
  float afVar117 [16];
  float afVar118 [16];
  float afVar119 [16];
  float afVar120 [16];
  float afVar121 [16];
  int aiVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  int iVar2;
  int iVar3;
  undefined1 auVar71 [32];
  undefined1 auVar75 [32];
  undefined1 auVar66 [16];
  undefined1 auVar78 [32];
  
  iVar4 = bottom_top_blob->c;
  if (0 < (long)iVar4) {
    uVar53 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    auVar80 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar81 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_C1,auVar80);
    auVar82 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_C2,auVar80);
    auVar83 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
    auVar84 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
    auVar85 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar80);
    lVar54 = 0;
    auVar107 = ZEXT3264(CONCAT428(0x80000000,
                                  CONCAT424(0x80000000,
                                            CONCAT420(0x80000000,
                                                      CONCAT416(0x80000000,
                                                                CONCAT412(0x80000000,
                                                                          CONCAT48(0x80000000,
                                                                                                                                                                      
                                                  0x8000000080000000)))))));
    afVar108 = _ps512_1;
    afVar110 = _ps512_exp_hi;
    afVar114 = _ps512_cephes_exp_p5;
    afVar115 = _ps512_cephes_exp_C1;
    afVar116 = _ps512_cephes_exp_C2;
    afVar117 = _ps512_cephes_exp_p0;
    afVar118 = _ps512_cephes_exp_p1;
    afVar119 = _ps512_cephes_exp_p2;
    afVar120 = _ps512_cephes_exp_p3;
    afVar121 = _ps512_cephes_exp_p4;
    aiVar122 = _ps512_min_norm_pos;
    afVar123 = _ps512_cephes_SQRTHF;
    afVar124 = _ps512_cephes_log_p0;
    afVar125 = _ps512_cephes_log_p1;
    afVar126 = _ps512_cephes_log_p2;
    afVar127 = _ps512_cephes_log_p3;
    afVar128 = _ps512_cephes_log_p4;
    afVar129 = _ps512_cephes_log_p5;
    do {
      afVar49 = _ps512_cephes_LOG2EF;
      afVar48 = _ps512_exp_lo;
      pauVar55 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar54 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar53 < 0x10) {
        uVar51 = 0;
      }
      else {
        iVar50 = 0xf;
        do {
          auVar107 = vorps_avx512dq(*pauVar55,auVar80);
          auVar107 = vminps_avx512f(auVar107,(undefined1  [64])afVar110);
          auVar107 = vmaxps_avx512f(auVar107,(undefined1  [64])afVar48);
          auVar86 = vfmadd213ps_avx512f((undefined1  [64])afVar49,auVar107,
                                        (undefined1  [64])afVar114);
          auVar87 = vrndscaleps_avx512f(auVar86,1);
          uVar7 = vcmpps_avx512f(auVar86,auVar87,1);
          auVar88 = vsubps_avx512f(auVar87,(undefined1  [64])afVar108);
          bVar5 = (bool)((byte)uVar7 & 1);
          auVar86._0_4_ = (uint)bVar5 * auVar88._0_4_ | (uint)!bVar5 * auVar87._0_4_;
          bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar86._4_4_ = (uint)bVar5 * auVar88._4_4_ | (uint)!bVar5 * auVar87._4_4_;
          bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar86._8_4_ = (uint)bVar5 * auVar88._8_4_ | (uint)!bVar5 * auVar87._8_4_;
          bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar86._12_4_ = (uint)bVar5 * auVar88._12_4_ | (uint)!bVar5 * auVar87._12_4_;
          bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
          auVar86._16_4_ = (uint)bVar5 * auVar88._16_4_ | (uint)!bVar5 * auVar87._16_4_;
          bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
          auVar86._20_4_ = (uint)bVar5 * auVar88._20_4_ | (uint)!bVar5 * auVar87._20_4_;
          bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
          auVar86._24_4_ = (uint)bVar5 * auVar88._24_4_ | (uint)!bVar5 * auVar87._24_4_;
          bVar5 = (bool)((byte)(uVar7 >> 7) & 1);
          auVar86._28_4_ = (uint)bVar5 * auVar88._28_4_ | (uint)!bVar5 * auVar87._28_4_;
          bVar5 = (bool)((byte)(uVar7 >> 8) & 1);
          auVar86._32_4_ = (uint)bVar5 * auVar88._32_4_ | (uint)!bVar5 * auVar87._32_4_;
          bVar5 = (bool)((byte)(uVar7 >> 9) & 1);
          auVar86._36_4_ = (uint)bVar5 * auVar88._36_4_ | (uint)!bVar5 * auVar87._36_4_;
          bVar5 = (bool)((byte)(uVar7 >> 10) & 1);
          auVar86._40_4_ = (uint)bVar5 * auVar88._40_4_ | (uint)!bVar5 * auVar87._40_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xb) & 1);
          auVar86._44_4_ = (uint)bVar5 * auVar88._44_4_ | (uint)!bVar5 * auVar87._44_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xc) & 1);
          auVar86._48_4_ = (uint)bVar5 * auVar88._48_4_ | (uint)!bVar5 * auVar87._48_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xd) & 1);
          auVar86._52_4_ = (uint)bVar5 * auVar88._52_4_ | (uint)!bVar5 * auVar87._52_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xe) & 1);
          auVar86._56_4_ = (uint)bVar5 * auVar88._56_4_ | (uint)!bVar5 * auVar87._56_4_;
          bVar5 = SUB81(uVar7 >> 0xf,0);
          auVar86._60_4_ = (uint)bVar5 * auVar88._60_4_ | (uint)!bVar5 * auVar87._60_4_;
          auVar107 = vfmadd231ps_avx512f(auVar107,auVar86,auVar81);
          auVar107 = vfmadd231ps_avx512f(auVar107,auVar86,auVar82);
          auVar87 = vmulps_avx512f(auVar107,auVar107);
          auVar88 = vfmadd213ps_avx512f(auVar107,(undefined1  [64])afVar117,
                                        (undefined1  [64])afVar118);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar107,(undefined1  [64])afVar119);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar107,(undefined1  [64])afVar120);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar107,(undefined1  [64])afVar121);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar107,(undefined1  [64])afVar114);
          auVar107 = vfmadd213ps_avx512f(auVar88,auVar87,auVar107);
          auVar87 = vaddps_avx512f(auVar107,(undefined1  [64])afVar108);
          auVar107 = vcvttps2dq_avx512f(auVar86);
          auVar107 = vpaddd_avx512f(auVar83,auVar107);
          auVar86 = vpslld_avx512f(auVar107,0x17);
          auVar107._8_4_ = 0x3f800000;
          auVar107._0_8_ = 0x3f8000003f800000;
          auVar107._12_4_ = 0x3f800000;
          auVar107._16_4_ = 0x3f800000;
          auVar107._20_4_ = 0x3f800000;
          auVar107._24_4_ = 0x3f800000;
          auVar107._28_4_ = 0x3f800000;
          auVar107._32_4_ = 0x3f800000;
          auVar107._36_4_ = 0x3f800000;
          auVar107._40_4_ = 0x3f800000;
          auVar107._44_4_ = 0x3f800000;
          auVar107._48_4_ = 0x3f800000;
          auVar107._52_4_ = 0x3f800000;
          auVar107._56_4_ = 0x3f800000;
          auVar107._60_4_ = 0x3f800000;
          auVar107 = vfmadd213ps_avx512f(auVar86,auVar87,auVar107);
          auVar86 = vmaxps_avx512f(auVar107,(undefined1  [64])aiVar122);
          auVar87 = vpsrld_avx512f(auVar86,0x17);
          auVar86 = vpternlogd_avx512f(auVar86,auVar84,(undefined1  [64])afVar114,0xea);
          uVar7 = vcmpps_avx512f(auVar86,(undefined1  [64])afVar123,1);
          auVar88 = vsubps_avx512f(auVar86,(undefined1  [64])afVar108);
          auVar86 = vaddps_avx512f(auVar88,auVar86);
          bVar5 = (bool)((byte)uVar7 & 1);
          auVar90._0_4_ = (uint)bVar5 * auVar86._0_4_ | (uint)!bVar5 * auVar88._0_4_;
          bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar90._4_4_ = (uint)bVar5 * auVar86._4_4_ | (uint)!bVar5 * auVar88._4_4_;
          bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar90._8_4_ = (uint)bVar5 * auVar86._8_4_ | (uint)!bVar5 * auVar88._8_4_;
          bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar90._12_4_ = (uint)bVar5 * auVar86._12_4_ | (uint)!bVar5 * auVar88._12_4_;
          bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
          auVar90._16_4_ = (uint)bVar5 * auVar86._16_4_ | (uint)!bVar5 * auVar88._16_4_;
          bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
          auVar90._20_4_ = (uint)bVar5 * auVar86._20_4_ | (uint)!bVar5 * auVar88._20_4_;
          bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
          auVar90._24_4_ = (uint)bVar5 * auVar86._24_4_ | (uint)!bVar5 * auVar88._24_4_;
          bVar5 = (bool)((byte)(uVar7 >> 7) & 1);
          auVar90._28_4_ = (uint)bVar5 * auVar86._28_4_ | (uint)!bVar5 * auVar88._28_4_;
          bVar6 = (byte)(uVar7 >> 8);
          bVar5 = (bool)(bVar6 & 1);
          auVar90._32_4_ = (uint)bVar5 * auVar86._32_4_ | (uint)!bVar5 * auVar88._32_4_;
          bVar5 = (bool)((byte)(uVar7 >> 9) & 1);
          auVar90._36_4_ = (uint)bVar5 * auVar86._36_4_ | (uint)!bVar5 * auVar88._36_4_;
          bVar5 = (bool)((byte)(uVar7 >> 10) & 1);
          auVar90._40_4_ = (uint)bVar5 * auVar86._40_4_ | (uint)!bVar5 * auVar88._40_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xb) & 1);
          auVar90._44_4_ = (uint)bVar5 * auVar86._44_4_ | (uint)!bVar5 * auVar88._44_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xc) & 1);
          auVar90._48_4_ = (uint)bVar5 * auVar86._48_4_ | (uint)!bVar5 * auVar88._48_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xd) & 1);
          auVar90._52_4_ = (uint)bVar5 * auVar86._52_4_ | (uint)!bVar5 * auVar88._52_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xe) & 1);
          auVar90._56_4_ = (uint)bVar5 * auVar86._56_4_ | (uint)!bVar5 * auVar88._56_4_;
          bVar5 = SUB81(uVar7 >> 0xf,0);
          auVar90._60_4_ = (uint)bVar5 * auVar86._60_4_ | (uint)!bVar5 * auVar88._60_4_;
          auVar86 = vmulps_avx512f(auVar90,auVar90);
          auVar88 = vfmadd213ps_avx512f(auVar90,(undefined1  [64])afVar124,
                                        (undefined1  [64])afVar125);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar90,(undefined1  [64])afVar126);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar90,(undefined1  [64])afVar127);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar90,(undefined1  [64])afVar128);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar90,(undefined1  [64])afVar129);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar90,(undefined1  [64])_ps512_cephes_log_p6);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar90,(undefined1  [64])_ps512_cephes_log_p7);
          auVar88 = vfmadd213ps_avx512f(auVar88,auVar90,(undefined1  [64])_ps512_cephes_log_p8);
          auVar89 = vmulps_avx512f(auVar86,auVar90);
          auVar90 = vfmadd213ps_avx512f(auVar89,auVar88,auVar90);
          auVar88 = vpternlogd_avx512f(auVar88,auVar88,auVar88,0xff);
          uVar8 = vcmpps_avx512f(auVar107,ZEXT864(0) << 0x20,2);
          auVar107 = vpsubd_avx512f(auVar87,auVar83);
          auVar107 = vcvtdq2ps_avx512f(auVar107);
          auVar87 = vaddps_avx512f(auVar107,(undefined1  [64])afVar108);
          bVar5 = (bool)((byte)uVar7 & 1);
          auVar89._0_4_ = (uint)bVar5 * auVar107._0_4_ | (uint)!bVar5 * auVar87._0_4_;
          bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar89._4_4_ = (uint)bVar5 * auVar107._4_4_ | (uint)!bVar5 * auVar87._4_4_;
          bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar89._8_4_ = (uint)bVar5 * auVar107._8_4_ | (uint)!bVar5 * auVar87._8_4_;
          bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar89._12_4_ = (uint)bVar5 * auVar107._12_4_ | (uint)!bVar5 * auVar87._12_4_;
          bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
          auVar89._16_4_ = (uint)bVar5 * auVar107._16_4_ | (uint)!bVar5 * auVar87._16_4_;
          bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
          auVar89._20_4_ = (uint)bVar5 * auVar107._20_4_ | (uint)!bVar5 * auVar87._20_4_;
          bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
          auVar89._24_4_ = (uint)bVar5 * auVar107._24_4_ | (uint)!bVar5 * auVar87._24_4_;
          bVar5 = (bool)((byte)(uVar7 >> 7) & 1);
          auVar89._28_4_ = (uint)bVar5 * auVar107._28_4_ | (uint)!bVar5 * auVar87._28_4_;
          bVar5 = (bool)(bVar6 & 1);
          auVar89._32_4_ = (uint)bVar5 * auVar107._32_4_ | (uint)!bVar5 * auVar87._32_4_;
          bVar5 = (bool)((byte)(uVar7 >> 9) & 1);
          auVar89._36_4_ = (uint)bVar5 * auVar107._36_4_ | (uint)!bVar5 * auVar87._36_4_;
          bVar5 = (bool)((byte)(uVar7 >> 10) & 1);
          auVar89._40_4_ = (uint)bVar5 * auVar107._40_4_ | (uint)!bVar5 * auVar87._40_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xb) & 1);
          auVar89._44_4_ = (uint)bVar5 * auVar107._44_4_ | (uint)!bVar5 * auVar87._44_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xc) & 1);
          auVar89._48_4_ = (uint)bVar5 * auVar107._48_4_ | (uint)!bVar5 * auVar87._48_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xd) & 1);
          auVar89._52_4_ = (uint)bVar5 * auVar107._52_4_ | (uint)!bVar5 * auVar87._52_4_;
          bVar5 = (bool)((byte)(uVar7 >> 0xe) & 1);
          auVar89._56_4_ = (uint)bVar5 * auVar107._56_4_ | (uint)!bVar5 * auVar87._56_4_;
          bVar5 = SUB81(uVar7 >> 0xf,0);
          auVar89._60_4_ = (uint)bVar5 * auVar107._60_4_ | (uint)!bVar5 * auVar87._60_4_;
          auVar107 = vfmadd231ps_avx512f(auVar90,auVar89,(undefined1  [64])afVar116);
          auVar107 = vfmadd231ps_avx512f(auVar107,auVar86,auVar85);
          auVar107 = vfmadd231ps_avx512f(auVar107,(undefined1  [64])afVar115,auVar89);
          bVar5 = (bool)((byte)uVar8 & 1);
          auVar87._0_4_ = (uint)bVar5 * auVar88._0_4_ | (uint)!bVar5 * auVar107._0_4_;
          bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
          auVar87._4_4_ = (uint)bVar5 * auVar88._4_4_ | (uint)!bVar5 * auVar107._4_4_;
          bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
          auVar87._8_4_ = (uint)bVar5 * auVar88._8_4_ | (uint)!bVar5 * auVar107._8_4_;
          bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
          auVar87._12_4_ = (uint)bVar5 * auVar88._12_4_ | (uint)!bVar5 * auVar107._12_4_;
          bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
          auVar87._16_4_ = (uint)bVar5 * auVar88._16_4_ | (uint)!bVar5 * auVar107._16_4_;
          bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
          auVar87._20_4_ = (uint)bVar5 * auVar88._20_4_ | (uint)!bVar5 * auVar107._20_4_;
          bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
          auVar87._24_4_ = (uint)bVar5 * auVar88._24_4_ | (uint)!bVar5 * auVar107._24_4_;
          bVar5 = (bool)((byte)(uVar8 >> 7) & 1);
          auVar87._28_4_ = (uint)bVar5 * auVar88._28_4_ | (uint)!bVar5 * auVar107._28_4_;
          bVar5 = (bool)((byte)(uVar8 >> 8) & 1);
          auVar87._32_4_ = (uint)bVar5 * auVar88._32_4_ | (uint)!bVar5 * auVar107._32_4_;
          bVar5 = (bool)((byte)(uVar8 >> 9) & 1);
          auVar87._36_4_ = (uint)bVar5 * auVar88._36_4_ | (uint)!bVar5 * auVar107._36_4_;
          bVar5 = (bool)((byte)(uVar8 >> 10) & 1);
          auVar87._40_4_ = (uint)bVar5 * auVar88._40_4_ | (uint)!bVar5 * auVar107._40_4_;
          bVar5 = (bool)((byte)(uVar8 >> 0xb) & 1);
          auVar87._44_4_ = (uint)bVar5 * auVar88._44_4_ | (uint)!bVar5 * auVar107._44_4_;
          bVar5 = (bool)((byte)(uVar8 >> 0xc) & 1);
          auVar87._48_4_ = (uint)bVar5 * auVar88._48_4_ | (uint)!bVar5 * auVar107._48_4_;
          bVar5 = (bool)((byte)(uVar8 >> 0xd) & 1);
          auVar87._52_4_ = (uint)bVar5 * auVar88._52_4_ | (uint)!bVar5 * auVar107._52_4_;
          bVar5 = (bool)((byte)(uVar8 >> 0xe) & 1);
          auVar87._56_4_ = (uint)bVar5 * auVar88._56_4_ | (uint)!bVar5 * auVar107._56_4_;
          bVar5 = SUB81(uVar8 >> 0xf,0);
          auVar87._60_4_ = (uint)bVar5 * auVar88._60_4_ | (uint)!bVar5 * auVar107._60_4_;
          auVar107 = vmaxps_avx512f(*pauVar55,ZEXT864(0) << 0x20);
          auVar107 = vaddps_avx512f(auVar87,auVar107);
          *pauVar55 = auVar107;
          pauVar55 = pauVar55 + 1;
          iVar50 = iVar50 + 0x10;
        } while (iVar50 < (int)uVar53);
        auVar107 = ZEXT3264(CONCAT428(0x80000000,
                                      CONCAT424(0x80000000,
                                                CONCAT420(0x80000000,
                                                          CONCAT416(0x80000000,
                                                                    CONCAT412(0x80000000,
                                                                              CONCAT48(0x80000000,
                                                                                                                                                                              
                                                  0x8000000080000000)))))));
        uVar51 = uVar53 & 0xfffffff0;
      }
      auVar73._8_4_ = 0x3f000000;
      auVar73._0_8_ = 0x3f0000003f000000;
      auVar73._12_4_ = 0x3f000000;
      auVar73._16_4_ = 0x3f000000;
      auVar73._20_4_ = 0x3f000000;
      auVar73._24_4_ = 0x3f000000;
      auVar73._28_4_ = 0x3f000000;
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      auVar72._8_4_ = 0x3f318000;
      auVar72._0_8_ = 0x3f3180003f318000;
      auVar72._12_4_ = 0x3f318000;
      auVar72._16_4_ = 0x3f318000;
      auVar72._20_4_ = 0x3f318000;
      auVar72._24_4_ = 0x3f318000;
      auVar72._28_4_ = 0x3f318000;
      auVar113._8_4_ = 0xb95e8083;
      auVar113._0_8_ = 0xb95e8083b95e8083;
      auVar113._12_4_ = 0xb95e8083;
      auVar113._16_4_ = 0xb95e8083;
      auVar113._20_4_ = 0xb95e8083;
      auVar113._24_4_ = 0xb95e8083;
      auVar113._28_4_ = 0xb95e8083;
      uVar52 = uVar51 | 7;
      afVar110 = _ps512_exp_hi;
      while (_ps512_exp_hi = afVar110, (int)uVar52 < (int)uVar53) {
        auVar78 = *(undefined1 (*) [32])*pauVar55;
        auVar74 = vorps_avx(auVar78,auVar107._0_32_);
        auVar68._8_4_ = 0x42b0c0a5;
        auVar68._0_8_ = 0x42b0c0a542b0c0a5;
        auVar68._12_4_ = 0x42b0c0a5;
        auVar68._16_4_ = 0x42b0c0a5;
        auVar68._20_4_ = 0x42b0c0a5;
        auVar68._24_4_ = 0x42b0c0a5;
        auVar68._28_4_ = 0x42b0c0a5;
        auVar68 = vminps_avx512vl(auVar74,auVar68);
        auVar74._8_4_ = 0xc2b0c0a5;
        auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar74._12_4_ = 0xc2b0c0a5;
        auVar74._16_4_ = 0xc2b0c0a5;
        auVar74._20_4_ = 0xc2b0c0a5;
        auVar74._24_4_ = 0xc2b0c0a5;
        auVar74._28_4_ = 0xc2b0c0a5;
        auVar68 = vmaxps_avx512vl(auVar68,auVar74);
        auVar69._8_4_ = 0x3fb8aa3b;
        auVar69._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar69._12_4_ = 0x3fb8aa3b;
        auVar69._16_4_ = 0x3fb8aa3b;
        auVar69._20_4_ = 0x3fb8aa3b;
        auVar69._24_4_ = 0x3fb8aa3b;
        auVar69._28_4_ = 0x3fb8aa3b;
        auVar69 = vfmadd231ps_avx512vl(auVar73,auVar68,auVar69);
        auVar74 = vroundps_avx(auVar69,1);
        uVar7 = vcmpps_avx512vl(auVar69,auVar74,1);
        auVar70 = vsubps_avx512vl(auVar74,auVar109);
        bVar5 = (bool)((byte)uVar7 & 1);
        auVar71._0_4_ = (float)((uint)bVar5 * auVar70._0_4_ | (uint)!bVar5 * auVar74._0_4_);
        bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar71._4_4_ = (float)((uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * auVar74._4_4_);
        bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar71._8_4_ = (float)((uint)bVar5 * auVar70._8_4_ | (uint)!bVar5 * auVar74._8_4_);
        bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar71._12_4_ = (float)((uint)bVar5 * auVar70._12_4_ | (uint)!bVar5 * auVar74._12_4_);
        bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
        auVar71._16_4_ = (float)((uint)bVar5 * auVar70._16_4_ | (uint)!bVar5 * auVar74._16_4_);
        bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
        auVar71._20_4_ = (float)((uint)bVar5 * auVar70._20_4_ | (uint)!bVar5 * auVar74._20_4_);
        bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
        auVar71._24_4_ = (float)((uint)bVar5 * auVar70._24_4_ | (uint)!bVar5 * auVar74._24_4_);
        bVar5 = SUB81(uVar7 >> 7,0);
        auVar71._28_4_ = (float)((uint)bVar5 * auVar70._28_4_ | (uint)!bVar5 * auVar74._28_4_);
        auVar61 = vfmsub231ps_fma(auVar68,auVar71,auVar72);
        auVar61 = vfnmsub231ps_fma(ZEXT1632(auVar61),auVar71,auVar113);
        auVar74 = ZEXT1632(auVar61);
        auVar45._28_4_ = auVar69._28_4_;
        auVar45._0_28_ =
             ZEXT1628(CONCAT412(auVar61._12_4_ * auVar61._12_4_,
                                CONCAT48(auVar61._8_4_ * auVar61._8_4_,
                                         CONCAT44(auVar61._4_4_ * auVar61._4_4_,
                                                  auVar61._0_4_ * auVar61._0_4_))));
        auVar105._8_4_ = 0x39506967;
        auVar105._0_8_ = 0x3950696739506967;
        auVar105._12_4_ = 0x39506967;
        auVar105._16_4_ = 0x39506967;
        auVar105._20_4_ = 0x39506967;
        auVar105._24_4_ = 0x39506967;
        auVar105._28_4_ = 0x39506967;
        auVar70._8_4_ = 0x3ab743ce;
        auVar70._0_8_ = 0x3ab743ce3ab743ce;
        auVar70._12_4_ = 0x3ab743ce;
        auVar70._16_4_ = 0x3ab743ce;
        auVar70._20_4_ = 0x3ab743ce;
        auVar70._24_4_ = 0x3ab743ce;
        auVar70._28_4_ = 0x3ab743ce;
        auVar72 = vfmadd213ps_avx512vl(auVar105,auVar74,auVar70);
        auVar28._8_4_ = 0x3c088908;
        auVar28._0_8_ = 0x3c0889083c088908;
        auVar28._12_4_ = 0x3c088908;
        auVar28._16_4_ = 0x3c088908;
        auVar28._20_4_ = 0x3c088908;
        auVar28._24_4_ = 0x3c088908;
        auVar28._28_4_ = 0x3c088908;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar74,auVar28);
        auVar29._8_4_ = 0x3d2aa9c1;
        auVar29._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar29._12_4_ = 0x3d2aa9c1;
        auVar29._16_4_ = 0x3d2aa9c1;
        auVar29._20_4_ = 0x3d2aa9c1;
        auVar29._24_4_ = 0x3d2aa9c1;
        auVar29._28_4_ = 0x3d2aa9c1;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar74,auVar29);
        auVar30._8_4_ = 0x3e2aaaaa;
        auVar30._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar30._12_4_ = 0x3e2aaaaa;
        auVar30._16_4_ = 0x3e2aaaaa;
        auVar30._20_4_ = 0x3e2aaaaa;
        auVar30._24_4_ = 0x3e2aaaaa;
        auVar30._28_4_ = 0x3e2aaaaa;
        auVar74 = ZEXT1632(auVar61);
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar74,auVar30);
        auVar61 = vfmadd213ps_fma(auVar72,auVar74,auVar73);
        auVar61 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar45,auVar74);
        auVar95._0_4_ = auVar61._0_4_ + 1.0;
        auVar95._4_4_ = auVar61._4_4_ + 1.0;
        auVar95._8_4_ = auVar61._8_4_ + 1.0;
        auVar95._12_4_ = auVar61._12_4_ + 1.0;
        auVar95._16_4_ = 0x3f800000;
        auVar95._20_4_ = 0x3f800000;
        auVar95._24_4_ = 0x3f800000;
        auVar95._28_4_ = 0x3f800000;
        auVar98._0_4_ = (int)auVar71._0_4_;
        auVar98._4_4_ = (int)auVar71._4_4_;
        auVar98._8_4_ = (int)auVar71._8_4_;
        auVar98._12_4_ = (int)auVar71._12_4_;
        auVar98._16_4_ = (int)auVar71._16_4_;
        auVar98._20_4_ = (int)auVar71._20_4_;
        auVar98._24_4_ = (int)auVar71._24_4_;
        auVar98._28_4_ = (int)auVar71._28_4_;
        auVar72 = vpslld_avx2(auVar98,0x17);
        auVar31._8_4_ = 0x3f800000;
        auVar31._0_8_ = 0x3f8000003f800000;
        auVar31._12_4_ = 0x3f800000;
        auVar31._16_4_ = 0x3f800000;
        auVar31._20_4_ = 0x3f800000;
        auVar31._24_4_ = 0x3f800000;
        auVar31._28_4_ = 0x3f800000;
        auVar72 = vpaddd_avx512vl(auVar72,auVar31);
        auVar61 = vfmadd213ps_fma(auVar72,auVar95,auVar109);
        uVar7 = vcmpps_avx512vl(ZEXT1632(auVar61),ZEXT1632(ZEXT816(0) << 0x40),2);
        auVar32._8_4_ = 0x800000;
        auVar32._0_8_ = 0x80000000800000;
        auVar32._12_4_ = 0x800000;
        auVar32._16_4_ = 0x800000;
        auVar32._20_4_ = 0x800000;
        auVar32._24_4_ = 0x800000;
        auVar32._28_4_ = 0x800000;
        auVar72 = vmaxps_avx512vl(ZEXT1632(auVar61),auVar32);
        auVar68 = vpsrld_avx2(auVar72,0x17);
        auVar101._8_4_ = 0x807fffff;
        auVar101._0_8_ = 0x807fffff807fffff;
        auVar101._12_4_ = 0x807fffff;
        auVar101._16_4_ = 0x807fffff;
        auVar101._20_4_ = 0x807fffff;
        auVar101._24_4_ = 0x807fffff;
        auVar101._28_4_ = 0x807fffff;
        auVar33._8_4_ = 0x3f000000;
        auVar33._0_8_ = 0x3f0000003f000000;
        auVar33._12_4_ = 0x3f000000;
        auVar33._16_4_ = 0x3f000000;
        auVar33._20_4_ = 0x3f000000;
        auVar33._24_4_ = 0x3f000000;
        auVar33._28_4_ = 0x3f000000;
        auVar72 = vpternlogd_avx512vl(auVar72,auVar101,auVar33,0xea);
        auVar34._8_4_ = 0x3f3504f3;
        auVar34._0_8_ = 0x3f3504f33f3504f3;
        auVar34._12_4_ = 0x3f3504f3;
        auVar34._16_4_ = 0x3f3504f3;
        auVar34._20_4_ = 0x3f3504f3;
        auVar34._24_4_ = 0x3f3504f3;
        auVar34._28_4_ = 0x3f3504f3;
        uVar8 = vcmpps_avx512vl(auVar72,auVar34,1);
        auVar35._8_4_ = 0xbf800000;
        auVar35._0_8_ = 0xbf800000bf800000;
        auVar35._12_4_ = 0xbf800000;
        auVar35._16_4_ = 0xbf800000;
        auVar35._20_4_ = 0xbf800000;
        auVar35._24_4_ = 0xbf800000;
        auVar35._28_4_ = 0xbf800000;
        auVar73 = vaddps_avx512vl(auVar72,auVar35);
        auVar74 = vaddps_avx512vl(auVar73,auVar72);
        bVar5 = (bool)((byte)uVar8 & 1);
        auVar75._0_4_ = (float)((uint)bVar5 * auVar74._0_4_ | (uint)!bVar5 * auVar73._0_4_);
        bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar75._4_4_ = (float)((uint)bVar5 * auVar74._4_4_ | (uint)!bVar5 * auVar73._4_4_);
        bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar75._8_4_ = (float)((uint)bVar5 * auVar74._8_4_ | (uint)!bVar5 * auVar73._8_4_);
        bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar75._12_4_ = (float)((uint)bVar5 * auVar74._12_4_ | (uint)!bVar5 * auVar73._12_4_);
        bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
        auVar75._16_4_ = (float)((uint)bVar5 * auVar74._16_4_ | (uint)!bVar5 * auVar73._16_4_);
        bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
        auVar75._20_4_ = (float)((uint)bVar5 * auVar74._20_4_ | (uint)!bVar5 * auVar73._20_4_);
        bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
        auVar75._24_4_ = (float)((uint)bVar5 * auVar74._24_4_ | (uint)!bVar5 * auVar73._24_4_);
        bVar5 = SUB81(uVar8 >> 7,0);
        auVar75._28_4_ = (uint)bVar5 * auVar74._28_4_ | (uint)!bVar5 * auVar73._28_4_;
        auVar46._4_4_ = auVar75._4_4_ * auVar75._4_4_;
        auVar46._0_4_ = auVar75._0_4_ * auVar75._0_4_;
        auVar46._8_4_ = auVar75._8_4_ * auVar75._8_4_;
        auVar46._12_4_ = auVar75._12_4_ * auVar75._12_4_;
        auVar46._16_4_ = auVar75._16_4_ * auVar75._16_4_;
        auVar46._20_4_ = auVar75._20_4_ * auVar75._20_4_;
        auVar46._24_4_ = auVar75._24_4_ * auVar75._24_4_;
        auVar46._28_4_ = auVar72._28_4_;
        auVar106._8_4_ = 0x3d9021bb;
        auVar106._0_8_ = 0x3d9021bb3d9021bb;
        auVar106._12_4_ = 0x3d9021bb;
        auVar106._16_4_ = 0x3d9021bb;
        auVar106._20_4_ = 0x3d9021bb;
        auVar106._24_4_ = 0x3d9021bb;
        auVar106._28_4_ = 0x3d9021bb;
        auVar36._8_4_ = 0xbdebd1b8;
        auVar36._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar36._12_4_ = 0xbdebd1b8;
        auVar36._16_4_ = 0xbdebd1b8;
        auVar36._20_4_ = 0xbdebd1b8;
        auVar36._24_4_ = 0xbdebd1b8;
        auVar36._28_4_ = 0xbdebd1b8;
        auVar72 = vfmadd213ps_avx512vl(auVar106,auVar75,auVar36);
        auVar37._8_4_ = 0x3def251a;
        auVar37._0_8_ = 0x3def251a3def251a;
        auVar37._12_4_ = 0x3def251a;
        auVar37._16_4_ = 0x3def251a;
        auVar37._20_4_ = 0x3def251a;
        auVar37._24_4_ = 0x3def251a;
        auVar37._28_4_ = 0x3def251a;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar75,auVar37);
        auVar38._8_4_ = 0xbdfe5d4f;
        auVar38._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar38._12_4_ = 0xbdfe5d4f;
        auVar38._16_4_ = 0xbdfe5d4f;
        auVar38._20_4_ = 0xbdfe5d4f;
        auVar38._24_4_ = 0xbdfe5d4f;
        auVar38._28_4_ = 0xbdfe5d4f;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar75,auVar38);
        auVar39._8_4_ = 0x3e11e9bf;
        auVar39._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar39._12_4_ = 0x3e11e9bf;
        auVar39._16_4_ = 0x3e11e9bf;
        auVar39._20_4_ = 0x3e11e9bf;
        auVar39._24_4_ = 0x3e11e9bf;
        auVar39._28_4_ = 0x3e11e9bf;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar75,auVar39);
        auVar40._8_4_ = 0xbe2aae50;
        auVar40._0_8_ = 0xbe2aae50be2aae50;
        auVar40._12_4_ = 0xbe2aae50;
        auVar40._16_4_ = 0xbe2aae50;
        auVar40._20_4_ = 0xbe2aae50;
        auVar40._24_4_ = 0xbe2aae50;
        auVar40._28_4_ = 0xbe2aae50;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar75,auVar40);
        auVar41._8_4_ = 0x3e4cceac;
        auVar41._0_8_ = 0x3e4cceac3e4cceac;
        auVar41._12_4_ = 0x3e4cceac;
        auVar41._16_4_ = 0x3e4cceac;
        auVar41._20_4_ = 0x3e4cceac;
        auVar41._24_4_ = 0x3e4cceac;
        auVar41._28_4_ = 0x3e4cceac;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar75,auVar41);
        auVar42._8_4_ = 0xbe7ffffc;
        auVar42._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar42._12_4_ = 0xbe7ffffc;
        auVar42._16_4_ = 0xbe7ffffc;
        auVar42._20_4_ = 0xbe7ffffc;
        auVar42._24_4_ = 0xbe7ffffc;
        auVar42._28_4_ = 0xbe7ffffc;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar75,auVar42);
        auVar43._8_4_ = 0x3eaaaaaa;
        auVar43._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar43._12_4_ = 0x3eaaaaaa;
        auVar43._16_4_ = 0x3eaaaaaa;
        auVar43._20_4_ = 0x3eaaaaaa;
        auVar43._24_4_ = 0x3eaaaaaa;
        auVar43._28_4_ = 0x3eaaaaaa;
        auVar72 = vfmadd213ps_avx512vl(auVar72,auVar75,auVar43);
        auVar47._4_4_ = auVar75._4_4_ * auVar75._4_4_ * auVar75._4_4_ * auVar72._4_4_;
        auVar47._0_4_ = auVar75._0_4_ * auVar75._0_4_ * auVar75._0_4_ * auVar72._0_4_;
        auVar47._8_4_ = auVar75._8_4_ * auVar75._8_4_ * auVar75._8_4_ * auVar72._8_4_;
        auVar47._12_4_ = auVar75._12_4_ * auVar75._12_4_ * auVar75._12_4_ * auVar72._12_4_;
        auVar47._16_4_ = auVar75._16_4_ * auVar75._16_4_ * auVar75._16_4_ * auVar72._16_4_;
        auVar47._20_4_ = auVar75._20_4_ * auVar75._20_4_ * auVar75._20_4_ * auVar72._20_4_;
        auVar47._24_4_ = auVar75._24_4_ * auVar75._24_4_ * auVar75._24_4_ * auVar72._24_4_;
        auVar47._28_4_ = auVar72._28_4_;
        auVar73._8_4_ = 0x3f000000;
        auVar73._0_8_ = 0x3f0000003f000000;
        auVar73._12_4_ = 0x3f000000;
        auVar73._16_4_ = 0x3f000000;
        auVar73._20_4_ = 0x3f000000;
        auVar73._24_4_ = 0x3f000000;
        auVar73._28_4_ = 0x3f000000;
        auVar44._8_4_ = 0xffffff82;
        auVar44._0_8_ = 0xffffff82ffffff82;
        auVar44._12_4_ = 0xffffff82;
        auVar44._16_4_ = 0xffffff82;
        auVar44._20_4_ = 0xffffff82;
        auVar44._24_4_ = 0xffffff82;
        auVar44._28_4_ = 0xffffff82;
        auVar72 = vpaddd_avx512vl(auVar68,auVar44);
        auVar72 = vcvtdq2ps_avx(auVar72);
        auVar74 = vsubps_avx512vl(auVar72,auVar109);
        bVar5 = (bool)((byte)uVar8 & 1);
        auVar76._0_4_ = (uint)bVar5 * auVar74._0_4_ | (uint)!bVar5 * auVar72._0_4_;
        bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar76._4_4_ = (uint)bVar5 * auVar74._4_4_ | (uint)!bVar5 * auVar72._4_4_;
        bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar76._8_4_ = (uint)bVar5 * auVar74._8_4_ | (uint)!bVar5 * auVar72._8_4_;
        bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar76._12_4_ = (uint)bVar5 * auVar74._12_4_ | (uint)!bVar5 * auVar72._12_4_;
        bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
        auVar76._16_4_ = (uint)bVar5 * auVar74._16_4_ | (uint)!bVar5 * auVar72._16_4_;
        bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
        auVar76._20_4_ = (uint)bVar5 * auVar74._20_4_ | (uint)!bVar5 * auVar72._20_4_;
        bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
        auVar76._24_4_ = (uint)bVar5 * auVar74._24_4_ | (uint)!bVar5 * auVar72._24_4_;
        bVar5 = SUB81(uVar8 >> 7,0);
        auVar76._28_4_ = (uint)bVar5 * auVar74._28_4_ | (uint)!bVar5 * auVar72._28_4_;
        auVar61 = vfmadd231ps_fma(auVar47,auVar76,auVar113);
        auVar61 = vfmsub231ps_fma(ZEXT1632(auVar61),auVar73,auVar46);
        auVar74 = vsubps_avx(ZEXT1632(auVar61),auVar75);
        auVar72._8_4_ = 0x3f318000;
        auVar72._0_8_ = 0x3f3180003f318000;
        auVar72._12_4_ = 0x3f318000;
        auVar72._16_4_ = 0x3f318000;
        auVar72._20_4_ = 0x3f318000;
        auVar72._24_4_ = 0x3f318000;
        auVar72._28_4_ = 0x3f318000;
        auVar61 = vfmsub231ps_fma(auVar74,auVar72,auVar76);
        uVar8 = vcmpps_avx512vl(ZEXT1632(ZEXT816(0) << 0x40),auVar78,1);
        auVar74 = vpcmpeqd_avx2(auVar76,auVar76);
        bVar5 = (bool)((byte)uVar7 & 1);
        auVar77._0_4_ = (uint)bVar5 * auVar74._0_4_ | (uint)!bVar5 * auVar61._0_4_;
        bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar77._4_4_ = (uint)bVar5 * auVar74._4_4_ | (uint)!bVar5 * auVar61._4_4_;
        bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar77._8_4_ = (uint)bVar5 * auVar74._8_4_ | (uint)!bVar5 * auVar61._8_4_;
        bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar77._12_4_ = (uint)bVar5 * auVar74._12_4_ | (uint)!bVar5 * auVar61._12_4_;
        iVar50 = (uint)((byte)(uVar7 >> 4) & 1) * auVar74._16_4_;
        auVar77._16_4_ = iVar50;
        iVar1 = (uint)((byte)(uVar7 >> 5) & 1) * auVar74._20_4_;
        auVar77._20_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar7 >> 6) & 1) * auVar74._24_4_;
        auVar77._24_4_ = iVar2;
        iVar3 = (uint)(byte)(uVar7 >> 7) * auVar74._28_4_;
        auVar77._28_4_ = iVar3;
        auVar78 = vaddps_avx512vl(auVar77,auVar78);
        bVar5 = (bool)((byte)uVar8 & 1);
        auVar79._0_4_ = (uint)bVar5 * auVar78._0_4_ | !bVar5 * auVar77._0_4_;
        bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar79._4_4_ = (uint)bVar5 * auVar78._4_4_ | !bVar5 * auVar77._4_4_;
        bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar79._8_4_ = (uint)bVar5 * auVar78._8_4_ | !bVar5 * auVar77._8_4_;
        bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar79._12_4_ = (uint)bVar5 * auVar78._12_4_ | !bVar5 * auVar77._12_4_;
        bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
        auVar79._16_4_ = (uint)bVar5 * auVar78._16_4_ | (uint)!bVar5 * iVar50;
        bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
        auVar79._20_4_ = (uint)bVar5 * auVar78._20_4_ | (uint)!bVar5 * iVar1;
        bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
        auVar79._24_4_ = (uint)bVar5 * auVar78._24_4_ | (uint)!bVar5 * iVar2;
        bVar5 = SUB81(uVar8 >> 7,0);
        auVar79._28_4_ = (uint)bVar5 * auVar78._28_4_ | (uint)!bVar5 * iVar3;
        *(undefined1 (*) [32])*pauVar55 = auVar79;
        pauVar55 = (undefined1 (*) [64])(*pauVar55 + 0x20);
        uVar52 = uVar51 + 0xf;
        uVar51 = uVar51 + 8;
        afVar110 = _ps512_exp_hi;
      }
      auVar62._8_4_ = 0x3f000000;
      auVar62._0_8_ = 0x3f0000003f000000;
      auVar62._12_4_ = 0x3f000000;
      auVar111._8_4_ = 0x3f800000;
      auVar111._0_8_ = 0x3f8000003f800000;
      auVar111._12_4_ = 0x3f800000;
      auVar61._8_4_ = 0x3f318000;
      auVar61._0_8_ = 0x3f3180003f318000;
      auVar61._12_4_ = 0x3f318000;
      uVar52 = uVar51 | 3;
      while ((int)uVar52 < (int)uVar53) {
        auVar66 = *(undefined1 (*) [16])*pauVar55;
        auVar57._8_4_ = 0x80000000;
        auVar57._0_8_ = 0x8000000080000000;
        auVar57._12_4_ = 0x80000000;
        auVar57 = vorps_avx512vl(auVar66,auVar57);
        auVar58._8_4_ = 0x42b0c0a5;
        auVar58._0_8_ = 0x42b0c0a542b0c0a5;
        auVar58._12_4_ = 0x42b0c0a5;
        auVar57 = vminps_avx512vl(auVar57,auVar58);
        auVar59._8_4_ = 0xc2b0c0a5;
        auVar59._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar59._12_4_ = 0xc2b0c0a5;
        auVar58 = vmaxps_avx512vl(auVar57,auVar59);
        auVar9._8_4_ = 0x3fb8aa3b;
        auVar9._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar9._12_4_ = 0x3fb8aa3b;
        auVar59 = vfmadd231ps_avx512vl(auVar62,auVar58,auVar9);
        auVar99._0_4_ = (int)auVar59._0_4_;
        auVar99._4_4_ = (int)auVar59._4_4_;
        auVar99._8_4_ = (int)auVar59._8_4_;
        auVar99._12_4_ = (int)auVar59._12_4_;
        auVar57 = vcvtdq2ps_avx(auVar99);
        uVar7 = vcmpps_avx512vl(auVar59,auVar57,1);
        auVar59 = vsubps_avx512vl(auVar57,auVar111);
        bVar5 = (bool)((byte)uVar7 & 1);
        auVar60._0_4_ = (float)((uint)bVar5 * auVar59._0_4_ | (uint)!bVar5 * auVar57._0_4_);
        bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar60._4_4_ = (float)((uint)bVar5 * auVar59._4_4_ | (uint)!bVar5 * auVar57._4_4_);
        bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar60._8_4_ = (float)((uint)bVar5 * auVar59._8_4_ | (uint)!bVar5 * auVar57._8_4_);
        bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar60._12_4_ = (float)((uint)bVar5 * auVar59._12_4_ | (uint)!bVar5 * auVar57._12_4_);
        auVar61 = vfmsub231ps_fma(auVar58,auVar60,auVar61);
        auVar112._8_4_ = 0xb95e8083;
        auVar112._0_8_ = 0xb95e8083b95e8083;
        auVar112._12_4_ = 0xb95e8083;
        auVar57 = vfnmsub231ps_fma(auVar61,auVar60,auVar112);
        auVar96._0_4_ = auVar57._0_4_ * auVar57._0_4_;
        auVar96._4_4_ = auVar57._4_4_ * auVar57._4_4_;
        auVar96._8_4_ = auVar57._8_4_ * auVar57._8_4_;
        auVar96._12_4_ = auVar57._12_4_ * auVar57._12_4_;
        auVar102._8_4_ = 0x39506967;
        auVar102._0_8_ = 0x3950696739506967;
        auVar102._12_4_ = 0x39506967;
        auVar10._8_4_ = 0x3ab743ce;
        auVar10._0_8_ = 0x3ab743ce3ab743ce;
        auVar10._12_4_ = 0x3ab743ce;
        auVar61 = vfmadd213ps_avx512vl(auVar102,auVar57,auVar10);
        auVar11._8_4_ = 0x3c088908;
        auVar11._0_8_ = 0x3c0889083c088908;
        auVar11._12_4_ = 0x3c088908;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar57,auVar11);
        auVar12._8_4_ = 0x3d2aa9c1;
        auVar12._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar12._12_4_ = 0x3d2aa9c1;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar57,auVar12);
        auVar13._8_4_ = 0x3e2aaaaa;
        auVar13._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar13._12_4_ = 0x3e2aaaaa;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar57,auVar13);
        auVar61 = vfmadd213ps_fma(auVar61,auVar57,auVar62);
        auVar61 = vfmadd213ps_fma(auVar61,auVar96,auVar57);
        auVar93._0_4_ = auVar61._0_4_ + 1.0;
        auVar93._4_4_ = auVar61._4_4_ + 1.0;
        auVar93._8_4_ = auVar61._8_4_ + 1.0;
        auVar93._12_4_ = auVar61._12_4_ + 1.0;
        auVar97._0_4_ = (int)auVar60._0_4_;
        auVar97._4_4_ = (int)auVar60._4_4_;
        auVar97._8_4_ = (int)auVar60._8_4_;
        auVar97._12_4_ = (int)auVar60._12_4_;
        auVar61 = vpslld_avx(auVar97,0x17);
        auVar14._8_4_ = 0x3f800000;
        auVar14._0_8_ = 0x3f8000003f800000;
        auVar14._12_4_ = 0x3f800000;
        auVar61 = vpaddd_avx512vl(auVar61,auVar14);
        auVar61 = vfmadd213ps_fma(auVar61,auVar93,auVar111);
        uVar7 = vcmpps_avx512vl(auVar61,ZEXT816(0) << 0x40,2);
        auVar15._8_4_ = 0x800000;
        auVar15._0_8_ = 0x80000000800000;
        auVar15._12_4_ = 0x800000;
        auVar61 = vmaxps_avx512vl(auVar61,auVar15);
        auVar57 = vpsrld_avx(auVar61,0x17);
        auVar100._8_4_ = 0x807fffff;
        auVar100._0_8_ = 0x807fffff807fffff;
        auVar100._12_4_ = 0x807fffff;
        auVar16._8_4_ = 0x3f000000;
        auVar16._0_8_ = 0x3f0000003f000000;
        auVar16._12_4_ = 0x3f000000;
        auVar61 = vpternlogd_avx512vl(auVar61,auVar100,auVar16,0xea);
        auVar17._8_4_ = 0x3f3504f3;
        auVar17._0_8_ = 0x3f3504f33f3504f3;
        auVar17._12_4_ = 0x3f3504f3;
        uVar8 = vcmpps_avx512vl(auVar61,auVar17,1);
        auVar18._8_4_ = 0xbf800000;
        auVar18._0_8_ = 0xbf800000bf800000;
        auVar18._12_4_ = 0xbf800000;
        auVar62 = vaddps_avx512vl(auVar61,auVar18);
        auVar61 = vaddps_avx512vl(auVar62,auVar61);
        bVar5 = (bool)((byte)uVar8 & 1);
        auVar63._0_4_ = (float)((uint)bVar5 * auVar61._0_4_ | (uint)!bVar5 * auVar62._0_4_);
        bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar63._4_4_ = (float)((uint)bVar5 * auVar61._4_4_ | (uint)!bVar5 * auVar62._4_4_);
        bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar63._8_4_ = (float)((uint)bVar5 * auVar61._8_4_ | (uint)!bVar5 * auVar62._8_4_);
        bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar63._12_4_ = (float)((uint)bVar5 * auVar61._12_4_ | (uint)!bVar5 * auVar62._12_4_);
        auVar94._0_4_ = auVar63._0_4_ * auVar63._0_4_;
        auVar94._4_4_ = auVar63._4_4_ * auVar63._4_4_;
        auVar94._8_4_ = auVar63._8_4_ * auVar63._8_4_;
        auVar94._12_4_ = auVar63._12_4_ * auVar63._12_4_;
        auVar103._8_4_ = 0x3d9021bb;
        auVar103._0_8_ = 0x3d9021bb3d9021bb;
        auVar103._12_4_ = 0x3d9021bb;
        auVar19._8_4_ = 0xbdebd1b8;
        auVar19._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar19._12_4_ = 0xbdebd1b8;
        auVar61 = vfmadd213ps_avx512vl(auVar103,auVar63,auVar19);
        auVar20._8_4_ = 0x3def251a;
        auVar20._0_8_ = 0x3def251a3def251a;
        auVar20._12_4_ = 0x3def251a;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar20);
        auVar21._8_4_ = 0xbdfe5d4f;
        auVar21._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar21._12_4_ = 0xbdfe5d4f;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar21);
        auVar22._8_4_ = 0x3e11e9bf;
        auVar22._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar22._12_4_ = 0x3e11e9bf;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar22);
        auVar23._8_4_ = 0xbe2aae50;
        auVar23._0_8_ = 0xbe2aae50be2aae50;
        auVar23._12_4_ = 0xbe2aae50;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar23);
        auVar24._8_4_ = 0x3e4cceac;
        auVar24._0_8_ = 0x3e4cceac3e4cceac;
        auVar24._12_4_ = 0x3e4cceac;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar24);
        auVar25._8_4_ = 0xbe7ffffc;
        auVar25._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar25._12_4_ = 0xbe7ffffc;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar25);
        auVar26._8_4_ = 0x3eaaaaaa;
        auVar26._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar26._12_4_ = 0x3eaaaaaa;
        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar63,auVar26);
        auVar104._0_4_ = auVar94._0_4_ * auVar63._0_4_ * auVar61._0_4_;
        auVar104._4_4_ = auVar94._4_4_ * auVar63._4_4_ * auVar61._4_4_;
        auVar104._8_4_ = auVar94._8_4_ * auVar63._8_4_ * auVar61._8_4_;
        auVar104._12_4_ = auVar94._12_4_ * auVar63._12_4_ * auVar61._12_4_;
        auVar62._8_4_ = 0x3f000000;
        auVar62._0_8_ = 0x3f0000003f000000;
        auVar62._12_4_ = 0x3f000000;
        auVar27._8_4_ = 0xffffff82;
        auVar27._0_8_ = 0xffffff82ffffff82;
        auVar27._12_4_ = 0xffffff82;
        auVar61 = vpaddd_avx512vl(auVar57,auVar27);
        auVar61 = vcvtdq2ps_avx(auVar61);
        auVar57 = vsubps_avx512vl(auVar61,auVar111);
        bVar5 = (bool)((byte)uVar8 & 1);
        auVar64._0_4_ = (uint)bVar5 * auVar57._0_4_ | (uint)!bVar5 * auVar61._0_4_;
        bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar64._4_4_ = (uint)bVar5 * auVar57._4_4_ | (uint)!bVar5 * auVar61._4_4_;
        bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar64._8_4_ = (uint)bVar5 * auVar57._8_4_ | (uint)!bVar5 * auVar61._8_4_;
        bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar64._12_4_ = (uint)bVar5 * auVar57._12_4_ | (uint)!bVar5 * auVar61._12_4_;
        auVar61 = vfmadd231ps_fma(auVar104,auVar64,auVar112);
        auVar61 = vfmsub231ps_fma(auVar61,auVar62,auVar94);
        auVar57 = vsubps_avx(auVar61,auVar63);
        auVar61._8_4_ = 0x3f318000;
        auVar61._0_8_ = 0x3f3180003f318000;
        auVar61._12_4_ = 0x3f318000;
        auVar58 = vfmsub231ps_fma(auVar57,auVar61,auVar64);
        uVar8 = vcmpps_avx512vl(ZEXT816(0) << 0x40,auVar66,1);
        auVar57 = vpcmpeqd_avx(auVar64,auVar64);
        bVar5 = (bool)((byte)uVar7 & 1);
        auVar65._0_4_ = (uint)bVar5 * auVar57._0_4_ | (uint)!bVar5 * auVar58._0_4_;
        bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar5 * auVar57._4_4_ | (uint)!bVar5 * auVar58._4_4_;
        bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar5 * auVar57._8_4_ | (uint)!bVar5 * auVar58._8_4_;
        bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar65._12_4_ = (uint)bVar5 * auVar57._12_4_ | (uint)!bVar5 * auVar58._12_4_;
        auVar66 = vaddps_avx512vl(auVar65,auVar66);
        bVar5 = (bool)((byte)uVar8 & 1);
        auVar67._0_4_ = (uint)bVar5 * auVar66._0_4_ | !bVar5 * auVar65._0_4_;
        bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar67._4_4_ = (uint)bVar5 * auVar66._4_4_ | !bVar5 * auVar65._4_4_;
        bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar67._8_4_ = (uint)bVar5 * auVar66._8_4_ | !bVar5 * auVar65._8_4_;
        bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar67._12_4_ = (uint)bVar5 * auVar66._12_4_ | !bVar5 * auVar65._12_4_;
        *(undefined1 (*) [16])*pauVar55 = auVar67;
        pauVar55 = (undefined1 (*) [64])(*pauVar55 + 0x10);
        uVar52 = uVar51 + 7;
        uVar51 = uVar51 + 4;
      }
      auVar80 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      if (uVar53 - uVar51 != 0 && (int)uVar51 <= (int)uVar53) {
        lVar56 = 0;
        do {
          fVar92 = *(float *)(*pauVar55 + lVar56 * 4);
          if (fVar92 <= 0.0) {
            fVar92 = expf(fVar92);
            fVar91 = logf(fVar92 + 1.0);
          }
          else {
            fVar91 = expf(-fVar92);
            fVar91 = logf(fVar91 + 1.0);
            fVar91 = fVar91 + fVar92;
          }
          *(float *)(*pauVar55 + lVar56 * 4) = fVar91;
          lVar56 = lVar56 + 1;
          auVar80 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar83 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          auVar84 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
          auVar107 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          afVar108 = _ps512_1;
          afVar110 = _ps512_exp_hi;
          afVar114 = _ps512_cephes_exp_p5;
          afVar115 = _ps512_cephes_exp_C1;
          afVar116 = _ps512_cephes_exp_C2;
          afVar117 = _ps512_cephes_exp_p0;
          afVar118 = _ps512_cephes_exp_p1;
          afVar119 = _ps512_cephes_exp_p2;
          afVar120 = _ps512_cephes_exp_p3;
          afVar121 = _ps512_cephes_exp_p4;
          aiVar122 = _ps512_min_norm_pos;
          afVar123 = _ps512_cephes_SQRTHF;
          afVar124 = _ps512_cephes_log_p0;
          afVar125 = _ps512_cephes_log_p1;
          afVar126 = _ps512_cephes_log_p2;
          afVar127 = _ps512_cephes_log_p3;
          afVar128 = _ps512_cephes_log_p4;
          afVar129 = _ps512_cephes_log_p5;
        } while (uVar53 - uVar51 != (int)lVar56);
      }
      lVar54 = lVar54 + 1;
    } while (lVar54 != iVar4);
  }
  return 0;
}

Assistant:

int BNLL_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}